

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O0

string * __thiscall
deqp::egl::(anonymous_namespace)::eglProfileMaskToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,EGLint mask)

{
  bool bVar1;
  bool first;
  undefined1 local_190 [8];
  ostringstream stream;
  EGLint mask_local;
  
  stream._372_4_ = SUB84(this,0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  if (stream._372_4_ == 0) {
    std::operator<<((ostream *)local_190,"<None>");
  }
  else {
    bVar1 = (stream._372_4_ & 1) != 0;
    if (bVar1) {
      std::operator<<((ostream *)local_190,"EGL_CONTEXT_OPENGL_CORE_PROFILE_BIT_KHR");
    }
    if ((stream._372_4_ & 2) != 0) {
      if (bVar1) {
        std::operator<<((ostream *)local_190,"|");
      }
      std::operator<<((ostream *)local_190,"EGL_CONTEXT_OPENGL_COMPATIBILITY_PROFILE_BIT_KHR");
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

string eglProfileMaskToString (EGLint mask)
{
	std::ostringstream	stream;

	if (mask == 0)
		stream << "<None>";
	else
	{
		bool first = true;

		if ((mask & EGL_CONTEXT_OPENGL_CORE_PROFILE_BIT_KHR) != 0)
		{
			if (!first)
				stream << "|";

			first = false;

			stream << "EGL_CONTEXT_OPENGL_CORE_PROFILE_BIT_KHR";
		}

		if ((mask & EGL_CONTEXT_OPENGL_COMPATIBILITY_PROFILE_BIT_KHR) != 0)
		{
			if (!first)
				stream << "|";

			stream << "EGL_CONTEXT_OPENGL_COMPATIBILITY_PROFILE_BIT_KHR";
		}
	}

	return stream.str();
}